

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O3

void __thiscall glTF::Buffer::SEncodedRegion::~SEncodedRegion(SEncodedRegion *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->DecodedData != (uint8_t *)0x0) {
    operator_delete__(this->DecodedData);
  }
  pcVar1 = (this->ID)._M_dataplus._M_p;
  paVar2 = &(this->ID).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~SEncodedRegion() { delete [] DecodedData; }